

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O0

bool QtPrivate::intersect_path
               (QGraphicsItem *item,QRectF *exposeRect,ItemSelectionMode mode,
               QTransform *deviceTransform,void *intersectData)

{
  bool bVar1;
  byte bVar2;
  QGraphicsItemPrivate *this;
  QTransform *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  QPainterPath *in_RDI;
  QPainterPath *in_R8;
  long in_FS_OFFSET;
  qreal qVar3;
  qreal qVar4;
  QGraphicsItemPrivate *itemd;
  bool keep;
  QPainterPath itemPath_1;
  QRectF itemSceneBoundingRect;
  QPainterPath itemPath;
  QRectF brect;
  QPainterPath scenePath;
  QTransform transform;
  qreal in_stack_fffffffffffffe10;
  QRectF *in_stack_fffffffffffffe20;
  bool local_1c9;
  ItemSelectionMode mode_00;
  QGraphicsItem *in_stack_fffffffffffffe60;
  QGraphicsItem *item_00;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 *local_150;
  bool local_148 [80];
  bool local_f8 [80];
  QTransform local_a8;
  undefined1 local_58 [80];
  long local_8;
  
  mode_00 = (ItemSelectionMode)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_150 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_150,in_R8);
  local_170 = 0xffffffffffffffff;
  local_168 = 0xffffffffffffffff;
  local_160 = 0xffffffffffffffff;
  local_158 = 0xffffffffffffffff;
  (**(code **)(*(long *)in_RDI + 0x18))(&local_170);
  _q_adjustRect((QRectF *)0xa27941);
  this = QGraphicsItemPrivate::get((QGraphicsItem *)0xa27950);
  bVar1 = QGraphicsItemPrivate::itemIsUntransformable(this);
  if (bVar1) {
    memcpy(local_58,&DAT_00b474a0,0x50);
    QGraphicsItem::deviceTransform(in_stack_fffffffffffffe60,(QTransform *)in_RDI);
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    QTransform::inverted(local_f8);
    QTransform::operator*(&local_a8,in_RCX);
    QTransform::map((QPainterPath *)&local_178);
    if ((in_EDX == 0) || (in_EDX == 2)) {
      bVar2 = QPainterPath::contains((QRectF *)&local_178);
    }
    else {
      bVar2 = QPainterPath::intersects((QRectF *)&local_178);
    }
    local_1c9 = (bool)(bVar2 & 1);
    if ((local_1c9 != false) && ((in_EDX == 0 || (in_EDX == 1)))) {
      local_1c9 = QGraphicsSceneIndexPrivate::itemCollidesWithPath
                            (in_stack_fffffffffffffe60,in_RDI,mode_00);
    }
    QPainterPath::~QPainterPath((QPainterPath *)&local_178);
  }
  else {
    local_198 = 0xffffffffffffffff;
    local_190 = 0xffffffffffffffff;
    local_188 = 0xffffffffffffffff;
    local_180 = 0xffffffffffffffff;
    if ((*(ulong *)&this->field_0x160 >> 0x3e & 1) == 0) {
      QTransform::mapRect((QRectF *)&local_198);
    }
    else {
      qVar3 = QTransform::dx(&this->sceneTransform);
      QTransform::dy(&this->sceneTransform);
      QRectF::translated(in_stack_fffffffffffffe20,qVar3,in_stack_fffffffffffffe10);
    }
    if ((in_EDX == 0) || (in_EDX == 2)) {
      bVar2 = QPainterPath::contains((QRectF *)&local_150);
    }
    else {
      bVar2 = QPainterPath::intersects((QRectF *)&local_150);
    }
    local_1c9 = (bool)(bVar2 & 1);
    if ((local_1c9 != false) && ((in_EDX == 0 || (in_EDX == 1)))) {
      item_00 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
      if ((*(ulong *)&this->field_0x160 >> 0x3e & 1) == 0) {
        QTransform::inverted(local_148);
        QTransform::map((QPainterPath *)&stack0xfffffffffffffe60);
      }
      else {
        qVar3 = QTransform::dx(&this->sceneTransform);
        qVar3 = -qVar3;
        qVar4 = QTransform::dy(&this->sceneTransform);
        QPainterPath::translated(qVar3,-qVar4);
      }
      local_1c9 = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item_00,in_RDI,mode_00);
      QPainterPath::~QPainterPath((QPainterPath *)&stack0xfffffffffffffe60);
    }
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c9;
}

Assistant:

static bool intersect_path(const QGraphicsItem *item, const QRectF &exposeRect, Qt::ItemSelectionMode mode,
                               const QTransform &deviceTransform, const void *intersectData)
    {
        const QPainterPath scenePath = *static_cast<const QPainterPath *>(intersectData);

        QRectF brect = item->boundingRect();
        _q_adjustRect(&brect);

        // ### Add test for this (without making things slower?)
        Q_UNUSED(exposeRect);

        bool keep = true;
        const QGraphicsItemPrivate *itemd = QGraphicsItemPrivate::get(item);
        if (itemd->itemIsUntransformable()) {
            // Untransformable items; map the scene rect to item coordinates.
            const QTransform transform = item->deviceTransform(deviceTransform);
            QPainterPath itemPath = (deviceTransform * transform.inverted()).map(scenePath);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = itemPath.contains(brect);
            else
                keep = itemPath.intersects(brect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape))
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
        } else {
            Q_ASSERT(!itemd->dirtySceneTransform);
            const QRectF itemSceneBoundingRect = itemd->sceneTransformTranslateOnly
                                               ? brect.translated(itemd->sceneTransform.dx(),
                                                                  itemd->sceneTransform.dy())
                                               : itemd->sceneTransform.mapRect(brect);
            if (mode == Qt::ContainsItemShape || mode == Qt::ContainsItemBoundingRect)
                keep = scenePath.contains(itemSceneBoundingRect);
            else
                keep = scenePath.intersects(itemSceneBoundingRect);
            if (keep && (mode == Qt::ContainsItemShape || mode == Qt::IntersectsItemShape)) {
                QPainterPath itemPath = itemd->sceneTransformTranslateOnly
                                      ? scenePath.translated(-itemd->sceneTransform.dx(),
                                                             -itemd->sceneTransform.dy())
                                      : itemd->sceneTransform.inverted().map(scenePath);
                keep = QGraphicsSceneIndexPrivate::itemCollidesWithPath(item, itemPath, mode);
            }
        }
        return keep;
    }